

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
nonius::detail::estimate_clock_cost<std::chrono::_V2::system_clock>
          (FloatDuration<std::chrono::_V2::system_clock> resolution)

{
  type_conflict __x;
  double dVar1;
  outlier_classification outliers;
  anon_class_16_2_7d74a361 __gen;
  int iVar2;
  duration<double,_std::ratio<1L,_1000000000L>_> *pdVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *in_RDI;
  int nsamples;
  vector<double,_std::allocator<double>_> times;
  TimingOf<std::chrono::_V2::system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&(run_for_at_least_argument_t<system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&>)>
  *r;
  int iters;
  anon_class_1_0_00000001_for_time_clock time_clock;
  duration<double,_std::ratio<1L,_1000000000L>_> time_limit;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  size_type in_stack_fffffffffffffe88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *peVar5;
  parameters *params;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_118;
  double local_100;
  duration<double,_std::ratio<1L,_1000000000L>_> local_f8;
  vector<double,_std::allocator<double>_> *local_f0;
  undefined1 *local_e0;
  undefined4 in_stack_ffffffffffffff30;
  double local_c8 [5];
  rep_conflict local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 local_58 [24];
  undefined1 *local_40;
  undefined4 local_34;
  rep_conflict local_30;
  duration<double,_std::ratio<1L,_1000000000L>_> local_18;
  __node_base local_10;
  
  peVar5 = in_RDI;
  local_18 = std::chrono::operator*
                       ((duration<double,_std::ratio<1L,_1000000000L>_> *)
                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                        (int *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  params = (parameters *)&stack0xffffffffffffffe0;
  std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<double,_std::ratio<1L,_1000000000L>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (duration<long,_std::ratio<1L,_1L>_> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  pdVar3 = std::min<std::chrono::duration<double,std::ratio<1l,1000000000l>>>
                     ((duration<double,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe58,
                      (duration<double,_std::ratio<1L,_1000000000L>_> *)0x21b3a2);
  local_10._M_nxt = (_Hash_node_base *)pdVar3->__r;
  local_30 = (rep_conflict)
             estimate_clock_cost<std::chrono::_V2::system_clock>::anon_class_16_2_7d74a361::
             anon_class_1_0_00000001_for_time_clock::operator()
                       ((anon_class_1_0_00000001_for_time_clock *)
                        in_stack_fffffffffffffe78._M_current,in_stack_fffffffffffffe74);
  local_34 = 10000;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_68 = 0;
  parameters::parameters((parameters *)0x21b406);
  local_a0 = (rep_conflict)
             std::chrono::
             duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                       ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe58);
  run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::estimate_clock_cost<std::chrono::_V2::system_clock>(std::chrono::duration<double,std::chrono::_V2::system_clock::period>)::_lambda(int)_1_&>
            (params,(Duration<std::chrono::_V2::system_clock>)local_a0,(int)((ulong)peVar5 >> 0x20),
             (anon_class_1_0_00000001_for_time_clock *)in_RDI);
  parameters::~parameters((parameters *)0x21b461);
  local_40 = local_58;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x21b47e);
  __x = std::chrono::operator/
                  ((duration<double,_std::ratio<1L,_1000000000L>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (duration<long,_std::ratio<1L,_1000000000L>_> *)
                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  dVar1 = ceil(__x);
  iVar2 = (int)dVar1;
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  last._M_current =
       (double *)
       std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_fffffffffffffe58);
  local_e0 = local_40;
  __gen._4_4_ = in_stack_fffffffffffffe6c;
  __gen._0_4_ = in_stack_fffffffffffffe68;
  __gen.r._0_4_ = in_stack_fffffffffffffe70;
  __gen.r._4_4_ = in_stack_fffffffffffffe74;
  local_f0 = (vector<double,_std::allocator<double>_> *)
             std::
             generate_n<std::back_insert_iterator<std::vector<double,std::allocator<double>>>,int,nonius::detail::estimate_clock_cost<std::chrono::_V2::system_clock>(std::chrono::duration<double,std::chrono::_V2::system_clock::period>)::_lambda()_1_>
                       ((back_insert_iterator<std::vector<double,_std::allocator<double>_>_>)
                        in_stack_fffffffffffffe78._M_current,in_stack_fffffffffffffe64,__gen);
  _Var4._M_current = local_c8;
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe58);
  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe58);
  local_100 = mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (_Var4,in_stack_fffffffffffffe78);
  std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<double,void>
            ((duration<double,std::ratio<1l,1000000000l>> *)&local_f8,&local_100);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe58);
  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe58);
  _Var4._M_current._4_4_ = iVar2;
  _Var4._M_current._0_4_ = in_stack_ffffffffffffff30;
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (_Var4,last);
  outliers.low_mild = (int)uStack_120;
  outliers._0_8_ = local_128;
  outliers.high_mild = (int)((ulong)uStack_120 >> 0x20);
  outliers.high_severe = local_118;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::
  environment_estimate(in_RDI,local_f8,outliers);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  return peVar5;
}

Assistant:

environment_estimate<FloatDuration<Clock>> estimate_clock_cost(FloatDuration<Clock> resolution) {
            auto time_limit = std::min(resolution * clock_cost_estimation_tick_limit, FloatDuration<Clock>(clock_cost_estimation_time_limit));
            auto time_clock = [](int k) {
                return detail::measure<Clock>([k]{
                    for(int i = 0; i < k; ++i) {
                        volatile auto ignored = Clock::now();
                        (void)ignored;
                    }
                }).elapsed;
            };
            time_clock(1);
            int iters = clock_cost_estimation_iterations;
            auto&& r = run_for_at_least<Clock>({}, chrono::duration_cast<Duration<Clock>>(clock_cost_estimation_time), iters, time_clock);
            std::vector<double> times;
            int nsamples = static_cast<int>(std::ceil(time_limit / r.elapsed));
            times.reserve(nsamples);
            std::generate_n(std::back_inserter(times), nsamples, [time_clock, &r]{
                        return (time_clock(r.iterations) / r.iterations).count();
                    });
            return {
                FloatDuration<Clock>(mean(times.begin(), times.end())),
                classify_outliers(times.begin(), times.end()),
            };
        }